

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitors.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int height;
  bool bVar5;
  int iVar6;
  uint uVar7;
  GLFWmonitor **ppGVar8;
  GLFWvidmode *pGVar9;
  GLFWvidmode *pGVar10;
  char *pcVar11;
  GLFWmonitor *pGVar12;
  GLFWmonitor *pGVar13;
  GLFWwindow *handle;
  bool bVar14;
  long lVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int count_1;
  int count_2;
  int count;
  float xscale;
  int height_mm;
  int width_mm;
  int y;
  uint local_8c;
  int local_88;
  int local_84;
  uint local_80;
  uint local_7c;
  uint local_78 [2];
  int local_70;
  float local_6c;
  float local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  GLFWmonitor **local_58;
  long local_50;
  GLFWvidmode *local_48;
  GLFWmonitor *local_40;
  GLFWvidmode *local_38;
  
  bVar5 = true;
  do {
    bVar14 = bVar5;
    iVar6 = getopt(argc,argv,"th");
    bVar5 = false;
  } while (iVar6 == 0x74);
  if (iVar6 == -1) {
    glfwSetErrorCallback(error_callback);
    iVar6 = glfwInit();
    if (iVar6 == 0) goto LAB_00113fc8;
    ppGVar8 = glfwGetMonitors(&local_70);
    if (0 < local_70) {
      lVar15 = 0;
      local_58 = ppGVar8;
      do {
        pGVar13 = local_58[lVar15];
        local_50 = lVar15;
        if (bVar14) {
          pGVar9 = glfwGetVideoMode(pGVar13);
          pGVar10 = glfwGetVideoModes(pGVar13,&local_88);
          glfwGetMonitorPos(pGVar13,(int *)&local_8c,(int *)&local_5c);
          glfwGetMonitorPhysicalSize(pGVar13,(int *)&local_60,(int *)&local_64);
          glfwGetMonitorContentScale(pGVar13,&local_68,&local_6c);
          pcVar11 = glfwGetMonitorName(pGVar13);
          pGVar12 = glfwGetPrimaryMonitor();
          pcVar16 = "secondary";
          if (pGVar12 == pGVar13) {
            pcVar16 = "primary";
          }
          printf("Name: %s (%s)\n",pcVar11,pcVar16);
          format_mode(pGVar9);
          printf("Current mode: %s\n",format_mode::buffer);
          printf("Virtual position: %i %i\n",(ulong)local_8c,(ulong)local_5c);
          printf("Content scale: %f %f\n",(double)local_68,(double)local_6c);
          printf("Physical size: %i x %i mm (%0.2f dpi)\n",
                 (double)(((float)pGVar9->width * 25.4) / (float)(int)local_60),(ulong)local_60,
                 (ulong)local_64);
          puts("Modes:");
          if (0 < local_88) {
            uVar18 = 0;
            do {
              format_mode(pGVar10);
              printf("%3u: %s",uVar18 & 0xffffffff,format_mode::buffer);
              auVar20[0] = -((char)pGVar10->width == (char)pGVar9->width);
              auVar20[1] = -(*(char *)((long)&pGVar10->width + 1) ==
                            *(char *)((long)&pGVar9->width + 1));
              auVar20[2] = -(*(char *)((long)&pGVar10->width + 2) ==
                            *(char *)((long)&pGVar9->width + 2));
              auVar20[3] = -(*(char *)((long)&pGVar10->width + 3) ==
                            *(char *)((long)&pGVar9->width + 3));
              auVar20[4] = -((char)pGVar10->height == (char)pGVar9->height);
              auVar20[5] = -(*(char *)((long)&pGVar10->height + 1) ==
                            *(char *)((long)&pGVar9->height + 1));
              auVar20[6] = -(*(char *)((long)&pGVar10->height + 2) ==
                            *(char *)((long)&pGVar9->height + 2));
              auVar20[7] = -(*(char *)((long)&pGVar10->height + 3) ==
                            *(char *)((long)&pGVar9->height + 3));
              auVar20[8] = -((char)pGVar10->redBits == (char)pGVar9->redBits);
              auVar20[9] = -(*(char *)((long)&pGVar10->redBits + 1) ==
                            *(char *)((long)&pGVar9->redBits + 1));
              auVar20[10] = -(*(char *)((long)&pGVar10->redBits + 2) ==
                             *(char *)((long)&pGVar9->redBits + 2));
              auVar20[0xb] = -(*(char *)((long)&pGVar10->redBits + 3) ==
                              *(char *)((long)&pGVar9->redBits + 3));
              auVar20[0xc] = -((char)pGVar10->greenBits == (char)pGVar9->greenBits);
              auVar20[0xd] = -(*(char *)((long)&pGVar10->greenBits + 1) ==
                              *(char *)((long)&pGVar9->greenBits + 1));
              auVar20[0xe] = -(*(char *)((long)&pGVar10->greenBits + 2) ==
                              *(char *)((long)&pGVar9->greenBits + 2));
              auVar20[0xf] = -(*(char *)((long)&pGVar10->greenBits + 3) ==
                              *(char *)((long)&pGVar9->greenBits + 3));
              uVar1 = pGVar9->blueBits;
              uVar3 = pGVar9->refreshRate;
              uVar2 = pGVar10->blueBits;
              uVar4 = pGVar10->refreshRate;
              auVar21[0] = -((char)uVar2 == (char)uVar1);
              auVar21[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
              auVar21[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
              auVar21[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
              auVar21[4] = -((char)uVar4 == (char)uVar3);
              auVar21[5] = -((char)((uint)uVar4 >> 8) == (char)((uint)uVar3 >> 8));
              auVar21[6] = -((char)((uint)uVar4 >> 0x10) == (char)((uint)uVar3 >> 0x10));
              auVar21[7] = -((char)((uint)uVar4 >> 0x18) == (char)((uint)uVar3 >> 0x18));
              auVar21[8] = 0xff;
              auVar21[9] = 0xff;
              auVar21[10] = 0xff;
              auVar21[0xb] = 0xff;
              auVar21[0xc] = 0xff;
              auVar21[0xd] = 0xff;
              auVar21[0xe] = 0xff;
              auVar21[0xf] = 0xff;
              auVar21 = auVar21 & auVar20;
              if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff) {
                printf(" (current mode)");
              }
              putchar(10);
              uVar18 = uVar18 + 1;
              pGVar10 = pGVar10 + 1;
            } while ((long)uVar18 < (long)local_88);
          }
        }
        else {
          local_38 = glfwGetVideoModes(pGVar13,(int *)&local_8c);
          if (0 < (int)local_8c) {
            uVar18 = 0;
            local_40 = pGVar13;
            do {
              pGVar10 = local_38;
              pGVar13 = local_40;
              pGVar9 = local_38 + uVar18;
              glfwWindowHint(0x21001,local_38[uVar18].redBits);
              glfwWindowHint(0x21002,pGVar10[uVar18].greenBits);
              glfwWindowHint(0x21003,pGVar10[uVar18].blueBits);
              glfwWindowHint(0x2100f,pGVar10[uVar18].refreshRate);
              pcVar11 = glfwGetMonitorName(pGVar13);
              local_48 = pGVar9;
              format_mode(pGVar9);
              printf("Testing mode %u on monitor %s: %s\n",uVar18 & 0xffffffff,pcVar11,
                     format_mode::buffer);
              iVar6 = pGVar10[uVar18].width;
              height = pGVar10[uVar18].height;
              pGVar13 = glfwGetPrimaryMonitor();
              handle = glfwCreateWindow(iVar6,height,"Video Mode Test",pGVar13,(GLFWwindow *)0x0);
              pGVar9 = local_48;
              if (handle == (GLFWwindow *)0x0) {
                format_mode(local_48);
                printf("Failed to enter mode %u: %s\n",uVar18 & 0xffffffff,format_mode::buffer);
              }
              else {
                glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
                glfwSetKeyCallback(handle,key_callback);
                glfwMakeContextCurrent(handle);
                gladLoadGLLoader(glfwGetProcAddress);
                glfwSwapInterval(1);
                glfwSetTime(0.0);
                while (dVar19 = glfwGetTime(), dVar19 < 5.0) {
                  (*glad_glClear)(0x4000);
                  glfwSwapBuffers(handle);
                  glfwPollEvents();
                  iVar6 = glfwWindowShouldClose(handle);
                  if (iVar6 != 0) {
                    puts("User terminated program");
                    goto LAB_00113fde;
                  }
                }
                (*glad_glGetIntegerv)(0xd52,(GLint *)&local_80);
                (*glad_glGetIntegerv)(0xd53,(GLint *)&local_7c);
                (*glad_glGetIntegerv)(0xd54,(GLint *)local_78);
                glfwGetWindowSize(handle,&local_88,&local_84);
                if (local_80 == pGVar9->redBits) {
                  uVar17 = (ulong)(uint)pGVar9->greenBits;
                  uVar7 = pGVar9->blueBits;
                  if ((local_7c != pGVar9->greenBits) ||
                     (uVar17 = (ulong)local_7c, local_78[0] != uVar7)) goto LAB_00113f35;
                }
                else {
                  uVar17 = (ulong)(uint)pGVar9->greenBits;
                  uVar7 = pGVar9->blueBits;
LAB_00113f35:
                  printf("*** Color bit mismatch: (%i %i %i) instead of (%i %i %i)\n",
                         (ulong)local_80,(ulong)local_7c,(ulong)local_78[0],
                         (ulong)(uint)pGVar9->redBits,uVar17,uVar7);
                }
                if (local_84 != pGVar9->height || local_88 != pGVar9->width) {
                  printf("*** Size mismatch: %ix%i instead of %ix%i\n");
                }
                puts("Closing window");
                glfwDestroyWindow(handle);
                glfwPollEvents();
              }
              uVar18 = uVar18 + 1;
            } while ((long)uVar18 < (long)(int)local_8c);
          }
        }
        lVar15 = local_50 + 1;
      } while (lVar15 < local_70);
    }
LAB_00113fde:
    glfwTerminate();
  }
  else {
    if (iVar6 != 0x68) {
      usage();
LAB_00113fc8:
      exit(1);
    }
    usage();
  }
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, i, count, mode = LIST_MODE;
    GLFWmonitor** monitors;

    while ((ch = getopt(argc, argv, "th")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
            case 't':
                mode = TEST_MODE;
                break;
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    monitors = glfwGetMonitors(&count);

    for (i = 0;  i < count;  i++)
    {
        if (mode == LIST_MODE)
            list_modes(monitors[i]);
        else if (mode == TEST_MODE)
            test_modes(monitors[i]);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}